

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReorder.c
# Opt level: O0

void Abc_NtkBddReorder(Abc_Ntk_t *pNtk,int fVerbose)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  reo_man *p_00;
  Abc_Obj_t *pObj;
  char *pcVar4;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  reo_man *p;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkRemoveDupFanins(pNtk);
  Abc_NtkMinimumBase(pNtk);
  iVar2 = Abc_NtkGetFaninMax(pNtk);
  p_00 = Extra_ReorderInit(iVar2,100);
  for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar2; local_2c = local_2c + 1) {
    pObj = Abc_NtkObj(pNtk,local_2c);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj), iVar2 != 0)) &&
       (iVar2 = Abc_ObjFaninNum(pObj), pFVar1 = _stdout, 2 < iVar2)) {
      if (fVerbose != 0) {
        pcVar4 = Abc_ObjName(pObj);
        fprintf(pFVar1,"%10s: ",pcVar4);
        pFVar1 = _stdout;
        uVar3 = Cudd_DagSize((DdNode *)(pObj->field_5).pData);
        fprintf(pFVar1,"Before = %5d  BDD nodes.  ",(ulong)uVar3);
      }
      Abc_NodeBddReorder(p_00,pObj);
      pFVar1 = _stdout;
      if (fVerbose != 0) {
        uVar3 = Cudd_DagSize((DdNode *)(pObj->field_5).pData);
        fprintf(pFVar1,"After = %5d  BDD nodes.\n",(ulong)uVar3);
      }
    }
  }
  Extra_ReorderQuit(p_00);
  return;
}

Assistant:

void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose )
{
	reo_man * p;
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    p = Extra_ReorderInit( Abc_NtkGetFaninMax(pNtk), 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFaninNum(pNode) < 3 )
            continue;
        if ( fVerbose )
            fprintf( stdout, "%10s: ", Abc_ObjName(pNode) );
        if ( fVerbose )
            fprintf( stdout, "Before = %5d  BDD nodes.  ", Cudd_DagSize((DdNode *)pNode->pData) );
        Abc_NodeBddReorder( p, pNode );
        if ( fVerbose )
            fprintf( stdout, "After = %5d  BDD nodes.\n", Cudd_DagSize((DdNode *)pNode->pData) );
    }
    Extra_ReorderQuit( p );
}